

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Field *a,Field *b)

{
  bool bVar1;
  bool local_41;
  Field *b_local;
  Field *a_local;
  SubTyper *this_local;
  
  bVar1 = Field::operator==(a,b);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    local_41 = false;
    if (((a->mutable_ == Immutable) && (local_41 = false, b->mutable_ == Immutable)) &&
       (local_41 = false, a->packedType == b->packedType)) {
      local_41 = isSubType(this,(Type)(a->type).id,(Type)(b->type).id);
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

bool SubTyper::isSubType(const Field& a, const Field& b) {
  if (a == b) {
    return true;
  }
  // Immutable fields can be subtypes.
  return a.mutable_ == Immutable && b.mutable_ == Immutable &&
         a.packedType == b.packedType && isSubType(a.type, b.type);
}